

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp3_gaptr.c
# Opt level: O0

nghttp3_range nghttp3_gaptr_get_first_gap_after(nghttp3_gaptr *gaptr,uint64_t offset)

{
  nghttp3_range nVar1;
  size_t sVar2;
  long lVar3;
  nghttp3_ksl *in_RDI;
  nghttp3_ksl_it it;
  nghttp3_range q;
  nghttp3_range r;
  long local_60;
  long *local_58;
  nghttp3_ksl_search in_stack_ffffffffffffffb0;
  nghttp3_ksl_key *in_stack_ffffffffffffffb8;
  nghttp3_ksl *in_stack_ffffffffffffffc0;
  uint64_t local_10;
  uint64_t local_8;
  
  sVar2 = nghttp3_ksl_len(in_RDI);
  if (sVar2 == 0) {
    local_10 = 0;
    local_8 = 0xffffffffffffffff;
  }
  else {
    nghttp3_ksl_lower_bound_search
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    if (((nghttp3_ksl_search)(ulong)*(uint *)(local_58 + 2) == in_stack_ffffffffffffffb0) &&
       (*local_58 == 0)) {
      __assert_fail("!nghttp3_ksl_it_end(&it)",
                    "/workspace/llm4binary/github/license_c_cmakelists/ngtcp2[P]nghttp3/lib/nghttp3_gaptr.c"
                    ,0x87,
                    "nghttp3_range nghttp3_gaptr_get_first_gap_after(nghttp3_gaptr *, uint64_t)");
    }
    lVar3 = *(long *)(local_60 + 0x78) * (long)in_stack_ffffffffffffffb0;
    local_10 = *(uint64_t *)((long)local_58 + lVar3 + 0x20);
    local_8 = *(uint64_t *)((long)local_58 + lVar3 + 0x28);
  }
  nVar1.end = local_8;
  nVar1.begin = local_10;
  return nVar1;
}

Assistant:

nghttp3_range nghttp3_gaptr_get_first_gap_after(nghttp3_gaptr *gaptr,
                                                uint64_t offset) {
  nghttp3_range q = {
    .begin = offset,
    .end = offset + 1,
  };
  nghttp3_ksl_it it;

  if (nghttp3_ksl_len(&gaptr->gap) == 0) {
    nghttp3_range r = {0, UINT64_MAX};
    return r;
  }

  it = nghttp3_ksl_lower_bound_search(&gaptr->gap, &q,
                                      nghttp3_ksl_range_exclusive_search);

  assert(!nghttp3_ksl_it_end(&it));

  return *(nghttp3_range *)nghttp3_ksl_it_key(&it);
}